

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t exr_finish(exr_context_t *pctxt)

{
  char *pcVar1;
  undefined8 *in_RDI;
  int failed;
  exr_result_t rv;
  exr_context_t ctxt;
  undefined4 uVar2;
  exr_result_t eVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  eVar3 = 0;
  if (in_RDI == (undefined8 *)0x0) {
    eVar3 = 2;
  }
  else {
    pcVar1 = (char *)*in_RDI;
    if (pcVar1 != (char *)0x0) {
      uVar2 = 0;
      if ((*pcVar1 == '\x01') || (*pcVar1 == '\x03')) {
        uVar2 = 1;
      }
      if ((*pcVar1 != '\0') && (*pcVar1 != '\x04')) {
        eVar3 = finalize_write((exr_context_t)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                               (int)((ulong)in_RDI >> 0x20));
      }
      if (*(long *)(pcVar1 + 0x90) != 0) {
        (**(code **)(pcVar1 + 0x90))(pcVar1,*(undefined8 *)(pcVar1 + 0x88),uVar2);
      }
      internal_exr_destroy_context((exr_context_t)CONCAT44(eVar3,uVar2));
    }
    *in_RDI = 0;
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_finish (exr_context_t* pctxt)
{
    exr_context_t ctxt;
    exr_result_t  rv = EXR_ERR_SUCCESS;

    if (!pctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    ctxt = *pctxt;
    if (ctxt)
    {
        int failed = 0;
        if (ctxt->mode == EXR_CONTEXT_WRITE ||
            ctxt->mode == EXR_CONTEXT_WRITING_DATA)
            failed = 1;

        if (ctxt->mode != EXR_CONTEXT_READ &&
            ctxt->mode != EXR_CONTEXT_TEMPORARY)
            rv = finalize_write (ctxt, failed);

        if (ctxt->destroy_fn) ctxt->destroy_fn (ctxt, ctxt->user_data, failed);

        internal_exr_destroy_context (ctxt);
    }
    *pctxt = NULL;

    return rv;
}